

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_DeleteProperty
              (Var instance,PropertyId propertyId,ScriptContext *scriptContext,
              PropertyOperationFlags propertyOperationFlags)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *instance_00;
  PropertyRecord *this;
  char16 *varName;
  JavascriptLibrary *pJVar3;
  RecyclableObject *recyclableObject;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    instance_local = JavascriptLibraryBase::GetTrue(&pJVar3->super_JavascriptLibraryBase);
  }
  else {
    instance_00 = VarTo<Js::RecyclableObject>(instance);
    BVar2 = IsUndefinedOrNull(instance_00);
    if (BVar2 != 0) {
      this = ScriptContext::GetPropertyName(scriptContext,propertyId);
      varName = PropertyRecord::GetBuffer(this);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec47,varName);
    }
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    BVar2 = DeleteProperty(instance_00,propertyId,propertyOperationFlags);
    instance_local = JavascriptLibrary::CreateBoolean(pJVar3,BVar2);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::OP_DeleteProperty(Var instance, PropertyId propertyId, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_DeleteProperty);
        if(TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetTrue();
        }

        RecyclableObject* recyclableObject = VarTo<RecyclableObject>(instance);
        if (JavascriptOperators::IsUndefinedOrNull(recyclableObject))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotDelete_NullOrUndefined,
                scriptContext->GetPropertyName(propertyId)->GetBuffer());
        }

        return scriptContext->GetLibrary()->CreateBoolean(
            JavascriptOperators::DeleteProperty(recyclableObject, propertyId, propertyOperationFlags));
        JIT_HELPER_END(Op_DeleteProperty);
    }